

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP4Deserializer::ParsePGIndexPerStep
          (BP4Deserializer *this,BufferSTL *bufferSTL,string *hostLanguage,size_t submetadatafileId,
          size_t step)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  mapped_type *this_00;
  unsigned_long uVar4;
  ProcessGroupIndex *in_RDX;
  string *in_RDI;
  ProcessGroupIndex index;
  size_t position;
  vector<char,_std::allocator<char>_> *buffer;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  size_t *position_00;
  string local_b8 [47];
  undefined1 in_stack_ffffffffffffff77;
  size_t *in_stack_ffffffffffffff78;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  BPBase *in_stack_ffffffffffffff88;
  char local_40;
  
  std::
  unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  ::operator[]((unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                *)in_RDX,(key_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  this_00 = std::
            unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::operator[]((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)in_RDX,
                         (key_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_00,0);
  position_00 = *(size_t **)(&in_RDI[0xd]._M_dataplus + *(long *)(*(long *)in_RDI + -0x20));
  uVar4 = helper::ReadValue<unsigned_long>
                    ((vector<char,_std::allocator<char>_> *)in_RDI,position_00,
                     SUB81((ulong)in_RDX >> 0x38,0));
  *(unsigned_long *)(&in_RDI[0xd]._M_dataplus + *(long *)(*(long *)in_RDI + -0x20)) =
       (long)position_00 + uVar4;
  helper::ReadValue<unsigned_long>
            ((vector<char,_std::allocator<char>_> *)in_RDI,position_00,
             SUB81((ulong)in_RDX >> 0x38,0));
  BPBase::ReadProcessGroupIndexHeader
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (bool)in_stack_ffffffffffffff77);
  if (local_40 == 'y') {
    in_RDI[0x17].field_2._M_local_buf[*(long *)(*(long *)in_RDI + -0x20)] = '\0';
  }
  uVar2 = (byte)in_RDI[0x17].field_2._M_local_buf[*(long *)(*(long *)in_RDI + -0x20)] & 1;
  std::__cxx11::string::string(local_b8,(string *)in_RDX);
  bVar1 = helper::IsRowMajor(in_RDI);
  uVar3 = (uint)bVar1;
  std::__cxx11::string::~string(local_b8);
  if (uVar2 != uVar3) {
    in_RDI[0x17].field_2._M_local_buf[*(long *)(*(long *)in_RDI + -0x20) + 1] = '\x01';
  }
  BPBase::ProcessGroupIndex::~ProcessGroupIndex(in_RDX);
  return;
}

Assistant:

void BP4Deserializer::ParsePGIndexPerStep(const BufferSTL &bufferSTL,
                                          const std::string hostLanguage, size_t submetadatafileId,
                                          size_t step)
{
    const auto &buffer = bufferSTL.m_Buffer;
    size_t position = m_MetadataIndexTable[submetadatafileId][step][0];
    // std::cout << step << ", " << position << std::endl;
    m_MetadataSet.DataPGCount =
        m_MetadataSet.DataPGCount +
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);

    // read length of pg index which is not used, only for moving the pointer
    helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);

    ProcessGroupIndex index =
        ReadProcessGroupIndexHeader(buffer, position, m_Minifooter.IsLittleEndian);
    if (index.IsColumnMajor == 'y')
    {
        m_IsRowMajor = false;
    }
    if (m_IsRowMajor != helper::IsRowMajor(hostLanguage))
    {
        m_ReverseDimensions = true;
    }
}